

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

size_t mpack_node_copy_data(mpack_node_t node,char *buffer,size_t bufsize)

{
  mpack_error_t error;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar1;
  
  tree = node.tree;
  pmVar1 = node.data;
  if (tree->error != mpack_ok) {
    return 0;
  }
  if (pmVar1->type - mpack_type_array < 0xfffffffd) {
    error = mpack_error_type;
  }
  else {
    if (pmVar1->len <= bufsize) {
      memcpy(buffer,tree->data + (long)(pmVar1->value).children,(ulong)pmVar1->len);
      return (ulong)pmVar1->len;
    }
    error = mpack_error_too_big;
  }
  mpack_tree_flag_error(tree,error);
  return 0;
}

Assistant:

size_t mpack_node_copy_data(mpack_node_t node, char* buffer, size_t bufsize) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_assert(bufsize == 0 || buffer != NULL, "buffer is NULL for maximum of %i bytes", (int)bufsize);

    mpack_type_t type = node.data->type;
    if (type != mpack_type_str && type != mpack_type_bin && type != mpack_type_ext) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    if (node.data->len > bufsize) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return 0;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    return (size_t)node.data->len;
}